

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

ostream * despot::operator<<(ostream *os,StateVar *var)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Name: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(var->super_NamedVar).name_._M_dataplus._M_p,
                      (var->super_NamedVar).name_._M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"PrevName:",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(var->prev_name_)._M_dataplus._M_p,(var->prev_name_)._M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"CurrName:",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(var->curr_name_)._M_dataplus._M_p,(var->curr_name_)._M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"FullyObs:",9);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(os,0));
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Values:",7);
  if ((var->super_NamedVar).super_Variable.values_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (var->super_NamedVar).super_Variable.values_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
      pbVar1 = (var->super_NamedVar).super_Variable.values_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,pbVar1[uVar4]._M_dataplus._M_p,pbVar1[uVar4]._M_string_length);
      bVar2 = uVar5 < (ulong)((long)(var->super_NamedVar).super_Variable.values_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(var->super_NamedVar).super_Variable.values_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const StateVar& var) {
	os << "Name: " << var.name_ << endl;
	os << "PrevName:" << var.prev_name_ << endl;
	os << "CurrName:" << var.curr_name_ << endl;
	os << "FullyObs:" << var.observed_ << endl;
	os << "Values:";

	for (unsigned int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	return os;
}